

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::handle_disk_error
          (torrent *this,string_view job_name,storage_error *error,peer_connection *c,disk_class rw)

{
  int *piVar1;
  uint uVar2;
  error_category *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  error_code local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [64];
  generic_error_category *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  local_50;
  generic_error_category *local_48;
  error_condition local_40;
  
  local_a8._20_4_ = rw;
  iVar8 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar8 != '\0') {
    uVar2 = (error->ec).val_;
    peVar3 = (error->ec).cat_;
    local_a8._24_8_ = this;
    local_a8._40_8_ = job_name._M_str;
    local_a8._48_8_ = c;
    (*peVar3->_vptr_error_category[4])((string *)&local_c8,peVar3,(ulong)uVar2);
    uVar4 = local_c8._0_8_;
    local_a8._32_8_ = operation_name(error->operation);
    uVar5 = local_a8._24_8_;
    resolve_filename_abi_cxx11_
              ((string *)(local_a8 + 0x38),(torrent *)local_a8._24_8_,
               (file_index_t)(int)*(int3 *)&error->field_0x10);
    (*((request_callback *)uVar5)->_vptr_request_callback[7])
              (uVar5,"disk error: (%d) %s [%*s : %s] in file: %s",(ulong)uVar2,uVar4,
               job_name._M_len & 0xffffffff,local_a8._40_8_,local_a8._32_8_,local_a8._56_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._56_8_ != &local_60) {
      operator_delete((void *)local_a8._56_8_,local_60._M_allocated_capacity + 1);
    }
    c = (peer_connection *)local_a8._48_8_;
    this = (torrent *)local_a8._24_8_;
    if ((string *)local_c8._0_8_ != (string *)&local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
      this = (torrent *)local_a8._24_8_;
    }
  }
  local_c8.cat_ =
       &boost::system::detail::cat_holder<void>::generic_category_instance.super_error_category;
  local_c8.val_ = 0xc;
  local_c8.failed_ = true;
  local_c8._5_3_ = 0;
  peVar3 = (error->ec).cat_;
  iVar8 = (*peVar3->_vptr_error_category[2])(peVar3,(ulong)(uint)(error->ec).val_);
  if ((char)iVar8 == '\0') {
    cVar6 = (**(code **)(*(long *)local_c8.cat_ + 0x18))(local_c8.cat_,error,local_c8.val_);
    if (cVar6 == '\0') {
      if (((error->ec).val_ == 0x7d) && (((error->ec).cat_)->id_ == 0x8fafd21e25c5e09b)) {
        return;
      }
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar8) + 0x68) & 0x49) != 0) {
        iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        resolve_filename_abi_cxx11_
                  ((string *)&local_c8,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
        get_handle((torrent *)local_a8);
        alert_manager::
        emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar8),&error->ec,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   &error->operation,(torrent_handle *)local_a8);
        if ((piece_picker *)local_a8._8_8_ != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar8 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ).
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar8 + -1;
          }
          if (iVar8 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
        if ((string *)local_c8._0_8_ != (string *)&local_b8) {
          operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
        }
      }
      if (local_a8._20_4_ == write) {
        local_c8.cat_ =
             &boost::system::detail::cat_holder<void>::generic_category_instance.
              super_error_category;
        local_c8.val_ = 0x1e;
        local_c8.failed_ = true;
        local_c8._5_3_ = 0;
        peVar3 = (error->ec).cat_;
        iVar8 = (*peVar3->_vptr_error_category[2])(peVar3,(ulong)(uint)(error->ec).val_);
        if ((char)iVar8 == '\0') {
          cVar6 = (**(code **)(*(long *)local_c8.cat_ + 0x18))(local_c8.cat_,error,local_c8.val_);
          if (cVar6 == '\0') {
            local_a8._56_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x10000000d;
            local_68 = &boost::system::detail::cat_holder<void>::generic_category_instance;
            peVar3 = (error->ec).cat_;
            iVar8 = (*peVar3->_vptr_error_category[2])(peVar3,(ulong)(uint)(error->ec).val_);
            if (((char)iVar8 == '\0') &&
               (iVar8 = (*(local_68->super_error_category)._vptr_error_category[3])
                                  (local_68,error,local_a8._56_8_ & 0xffffffff), (char)iVar8 == '\0'
               )) {
              local_a8._0_8_ = (_func_int **)0x100000001;
              local_a8._8_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
              peVar3 = (error->ec).cat_;
              iVar8 = (*peVar3->_vptr_error_category[2])(peVar3,(ulong)(uint)(error->ec).val_);
              if (((char)iVar8 == '\0') &&
                 (iVar8 = (*(code *)(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_start[3])
                                    (local_a8._8_8_,error,local_a8._0_8_ & 0xffffffff),
                 (char)iVar8 == '\0')) {
                local_40.val_ = 0x1c;
                local_40.failed_ = true;
                local_40._5_3_ = 0;
                local_40.cat_ =
                     &boost::system::detail::cat_holder<void>::generic_category_instance.
                      super_error_category;
                bVar7 = boost::system::operator==(&error->ec,&local_40);
                if (!bVar7) {
                  local_50._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
                       (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                        )(_Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                          )0x10000001b;
                  local_48 = &boost::system::detail::cat_holder<void>::generic_category_instance;
                  bVar7 = boost::system::operator==(&error->ec,(error_condition *)&local_50);
                  if (!bVar7) goto LAB_0031adfc;
                }
              }
            }
          }
        }
        set_upload_mode(this,true);
        return;
      }
LAB_0031adfc:
      set_error(this,&error->ec,(file_index_t)(int)*(int3 *)&error->field_0x10);
      pause(this);
      return;
    }
  }
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar8) + 0x68) & 0x49) != 0) {
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    resolve_filename_abi_cxx11_
              ((string *)&local_c8,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
    get_handle((torrent *)local_a8);
    alert_manager::
    emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar8),&error->ec,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
               &error->operation,(torrent_handle *)local_a8);
    if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_a8._8_8_ !=
        (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_a8._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
    if ((string *)local_c8._0_8_ != (string *)&local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
    }
  }
  if (c != (peer_connection *)0x0) {
    local_c8 = errors::make_error_code(no_memory);
    (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
              (c,(string *)&local_c8,(ulong)error->operation,0);
  }
  return;
}

Assistant:

void torrent::handle_disk_error(string_view job_name
		, storage_error const& error
		, peer_connection* c
		, disk_class rw)
	{
		TORRENT_UNUSED(job_name);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(error);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("disk error: (%d) %s [%*s : %s] in file: %s"
				, error.ec.value(), error.ec.message().c_str()
				, int(job_name.size()), job_name.data()
				, operation_name(error.operation)
				, resolve_filename(error.file()).c_str());
		}
#endif

		if (error.ec == boost::system::errc::not_enough_memory)
		{
			if (alerts().should_post<file_error_alert>())
				alerts().emplace_alert<file_error_alert>(error.ec
					, resolve_filename(error.file()), error.operation, get_handle());
			if (c) c->disconnect(errors::no_memory, error.operation);
			return;
		}

		if (error.ec == boost::asio::error::operation_aborted) return;

		// notify the user of the error
		if (alerts().should_post<file_error_alert>())
			alerts().emplace_alert<file_error_alert>(error.ec
				, resolve_filename(error.file()), error.operation, get_handle());

		// if a write operation failed, and future writes are likely to
		// fail, while reads may succeed, just set the torrent to upload mode
		// if we make an incorrect assumption here, it's not the end of the
		// world, if we ever issue a read request and it fails as well, we
		// won't get in here and we'll actually end up pausing the torrent
		if (rw == disk_class::write
			&& (error.ec == boost::system::errc::read_only_file_system
			|| error.ec == boost::system::errc::permission_denied
			|| error.ec == boost::system::errc::operation_not_permitted
			|| error.ec == boost::system::errc::no_space_on_device
			|| error.ec == boost::system::errc::file_too_large))
		{
			// if we failed to write, stop downloading and just
			// keep seeding.
			// TODO: 1 make this depend on the error and on the filesystem the
			// files are being downloaded to. If the error is no_space_left_on_device
			// and the filesystem doesn't support sparse files, only zero the priorities
			// of the pieces that are at the tails of all files, leaving everything
			// up to the highest written piece in each file
			set_upload_mode(true);
			return;
		}

		// put the torrent in an error-state
		set_error(error.ec, error.file());

		// if the error appears to be more serious than a full disk, just pause the torrent
		pause();
	}